

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_wrapper_dump(char *filename)

{
  FILE *__stream;
  FILE *f;
  int i;
  char *filename_local;
  
  __stream = fopen(filename,"w");
  if (__stream != (FILE *)0x0) {
    for (f._4_4_ = 0; f._4_4_ < stb__alloc_size; f._4_4_ = f._4_4_ + 1) {
      if ((void *)0x1 < stb__allocations[f._4_4_].p) {
        fprintf(__stream,"%p %7d - %4d %s\n",stb__allocations[f._4_4_].p,
                (ulong)(uint)stb__allocations[f._4_4_].size,
                (ulong)(uint)stb__allocations[f._4_4_].line,stb__allocations[f._4_4_].file);
      }
    }
  }
  return;
}

Assistant:

void stb_wrapper_dump(char *filename)
{
   int i;
   FILE *f = fopen(filename, "w");
   if (!f) return;
   for (i=0; i < stb__alloc_size; ++i)
      if (stb__allocations[i].p > STB_DEL)
         fprintf(f, "%p %7d - %4d %s\n",
            stb__allocations[i].p   , stb__allocations[i].size,
            stb__allocations[i].line, stb__allocations[i].file);
}